

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

void __thiscall
Omega_h::Future<double>::Future
          (Future<double> *this,Read<double> *sendbuf,Write<double> *recvbuf,requests_type *requests
          ,callback_type *callback)

{
  callback_type *callback_local;
  requests_type *requests_local;
  Write<double> *recvbuf_local;
  Read<double> *sendbuf_local;
  Future<double> *this_local;
  
  Read<double>::Read(&this->sendbuf_,sendbuf);
  Write<double>::Write(&this->recvbuf_,recvbuf);
  std::function<Omega_h::Read<double>_(Omega_h::Write<double>)>::function(&this->callback_,callback)
  ;
  std::vector<int,_std::allocator<int>_>::vector(&this->requests_,requests);
  this->status_ = waiting;
  return;
}

Assistant:

Future<T>::Future(Read<T> sendbuf, Write<T> recvbuf,
    const requests_type&& requests, const callback_type callback)
    : sendbuf_(sendbuf),
      recvbuf_(recvbuf),
      callback_(callback),
      requests_(requests),
      status_(Status::waiting) {}